

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.h
# Opt level: O0

pair<std::shared_ptr<vmips::CFGNode>,_std::shared_ptr<vmips::CFGNode>_> * __thiscall
vmips::CFGNode::branch<vmips::beq,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
          (pair<std::shared_ptr<vmips::CFGNode>,_std::shared_ptr<vmips::CFGNode>_>
           *__return_storage_ptr__,CFGNode *this,string *next,string *target,
          shared_ptr<vmips::VirtReg> *args,shared_ptr<vmips::VirtReg> *args_1)

{
  weak_ptr<vmips::CFGNode> local_a8;
  weak_ptr<vmips::CFGNode> local_98;
  shared_ptr<vmips::Instruction> local_88;
  undefined1 local_78 [8];
  shared_ptr<vmips::beq> instr;
  undefined1 local_58 [8];
  shared_ptr<vmips::CFGNode> b;
  shared_ptr<vmips::CFGNode> a;
  shared_ptr<vmips::VirtReg> *args_local_1;
  shared_ptr<vmips::VirtReg> *args_local;
  string *target_local;
  string *next_local;
  CFGNode *this_local;
  
  std::make_shared<vmips::CFGNode,vmips::Function*&,std::__cxx11::string&>
            ((Function **)
             &b.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::make_shared<vmips::CFGNode,vmips::Function*&,std::__cxx11::string&>
            ((Function **)local_58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::
  make_shared<vmips::beq,std::shared_ptr<vmips::CFGNode>&,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
            ((shared_ptr<vmips::CFGNode> *)local_78,(shared_ptr<vmips::VirtReg> *)local_58,args);
  std::shared_ptr<vmips::Instruction>::shared_ptr<vmips::beq,void>
            (&local_88,(shared_ptr<vmips::beq> *)local_78);
  std::
  vector<std::shared_ptr<vmips::Instruction>,_std::allocator<std::shared_ptr<vmips::Instruction>_>_>
  ::push_back((vector<std::shared_ptr<vmips::Instruction>,_std::allocator<std::shared_ptr<vmips::Instruction>_>_>
               *)(this + 0x30),&local_88);
  std::shared_ptr<vmips::Instruction>::~shared_ptr(&local_88);
  std::weak_ptr<vmips::CFGNode>::weak_ptr<vmips::CFGNode,void>
            (&local_98,
             (shared_ptr<vmips::CFGNode> *)
             &b.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::vector<std::weak_ptr<vmips::CFGNode>,_std::allocator<std::weak_ptr<vmips::CFGNode>_>_>::
  push_back((vector<std::weak_ptr<vmips::CFGNode>,_std::allocator<std::weak_ptr<vmips::CFGNode>_>_>
             *)(this + 0x48),&local_98);
  std::weak_ptr<vmips::CFGNode>::~weak_ptr(&local_98);
  std::weak_ptr<vmips::CFGNode>::weak_ptr<vmips::CFGNode,void>
            (&local_a8,(shared_ptr<vmips::CFGNode> *)local_58);
  std::vector<std::weak_ptr<vmips::CFGNode>,_std::allocator<std::weak_ptr<vmips::CFGNode>_>_>::
  push_back((vector<std::weak_ptr<vmips::CFGNode>,_std::allocator<std::weak_ptr<vmips::CFGNode>_>_>
             *)(this + 0x48),&local_a8);
  std::weak_ptr<vmips::CFGNode>::~weak_ptr(&local_a8);
  std::pair<std::shared_ptr<vmips::CFGNode>,_std::shared_ptr<vmips::CFGNode>_>::
  pair<std::shared_ptr<vmips::CFGNode>_&,_std::shared_ptr<vmips::CFGNode>_&,_true>
            (__return_storage_ptr__,
             (shared_ptr<vmips::CFGNode> *)
             &b.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr<vmips::CFGNode> *)local_58);
  std::shared_ptr<vmips::beq>::~shared_ptr((shared_ptr<vmips::beq> *)local_78);
  std::shared_ptr<vmips::CFGNode>::~shared_ptr((shared_ptr<vmips::CFGNode> *)local_58);
  std::shared_ptr<vmips::CFGNode>::~shared_ptr
            ((shared_ptr<vmips::CFGNode> *)
             &b.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::shared_ptr<CFGNode>, std::shared_ptr<CFGNode>>
        branch(std::string next, std::string target, Args &&... args) {
            auto a = std::make_shared<CFGNode>(function, next);
            auto b = std::make_shared<CFGNode>(function, target);
            auto instr = std::make_shared<Instr>(b, std::forward<Args>(args)...);
            instructions.push_back(instr);
            out_edges.push_back(a);
            out_edges.push_back(b);
            return {a, b};
        }